

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

target_ulong pc_relative_pc(DisasContext_conflict6 *ctx)

{
  int iVar1;
  target_ulong tStack_18;
  int branch_bytes;
  target_ulong pc;
  DisasContext_conflict6 *ctx_local;
  
  tStack_18 = (ctx->base).pc_next;
  if ((ctx->hflags & 0x87f800) != 0) {
    iVar1 = 4;
    if ((ctx->hflags & 0x8000) != 0) {
      iVar1 = 2;
    }
    tStack_18 = tStack_18 - (long)iVar1;
  }
  return tStack_18 & 0xfffffffffffffffc;
}

Assistant:

static target_ulong pc_relative_pc(DisasContext *ctx)
{
    target_ulong pc = ctx->base.pc_next;

    if (ctx->hflags & MIPS_HFLAG_BMASK) {
        int branch_bytes = ctx->hflags & MIPS_HFLAG_BDS16 ? 2 : 4;

        pc -= branch_bytes;
    }

    pc &= ~(target_ulong)3;
    return pc;
}